

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

mir_size_t var_align(c2m_ctx_t c2m_ctx,type *type)

{
  int iVar1;
  int align;
  type *type_local;
  c2m_ctx_t c2m_ctx_local;
  
  raw_type_size(c2m_ctx,type);
  if (-1 < type->align) {
    iVar1 = x86_adjust_var_alignment(c2m_ctx,type->align,type);
    return (long)iVar1;
  }
  __assert_fail("align >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x17da,"mir_size_t var_align(c2m_ctx_t, struct type *)");
}

Assistant:

static mir_size_t var_align (c2m_ctx_t c2m_ctx, struct type *type) {
  int align;

  raw_type_size (c2m_ctx, type); /* check */
  align = type->align;
  assert (align >= 0);
#ifdef ADJUST_VAR_ALIGNMENT
  align = ADJUST_VAR_ALIGNMENT (c2m_ctx, align, type);
#endif
  return align;
}